

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

vm_obj_id_t __thiscall
TadsHttpRequest::prep_event_obj(TadsHttpRequest *this,int *argc,int *evt_type)

{
  vm_obj_id_t vVar1;
  TadsHttpListenerThread *this_00;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  TadsHttpRequest *in_RDI;
  int unaff_retaddr;
  vm_obj_id_t srv_obj;
  vm_obj_id_t obj;
  undefined4 in_stack_ffffffffffffffe0;
  TadsHttpRequest *req;
  
  req = in_RDI;
  this_00 = TadsHttpServerThread::get_listener(in_RDI->thread);
  obj = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  vVar1 = TadsHttpListenerThread::get_server_obj(this_00);
  CVmObjHTTPRequest::create(unaff_retaddr,req,(vm_obj_id_t)((ulong)in_RSI >> 0x20));
  CVmRun::push_obj((CVmRun *)CONCAT44(vVar1,in_stack_ffffffffffffffe0),obj);
  *in_RSI = 1;
  *in_RDX = 1;
  return G_predef_X.net_request_event;
}

Assistant:

vm_obj_id_t TadsHttpRequest::prep_event_obj(VMG_ int *argc, int *evt_type)
{
    /* get the HTTPServer object that created the listener thread */
    vm_obj_id_t srv_obj = thread->get_listener()->get_server_obj();

    /* create and push the HTTPRequest object */
    G_interpreter->push_obj(
        vmg_ CVmObjHTTPRequest::create(vmg_ FALSE, this, srv_obj));

    /* we added one argument to the constructor */
    *argc = 1;

    /* the event type is NetEvRequest (1 - see include/tadsnet.h) */
    *evt_type = 1;

    /* the event subclass is NetRequestEvent */
    return G_predef->net_request_event;
}